

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

bool Assimp::Q3Shader::LoadSkin(SkinData *fill,string *pFile,IOSystem *io)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  _List_node_base *p_Var4;
  int iVar5;
  undefined4 extraout_var;
  Logger *this;
  long lVar7;
  byte *pbVar8;
  ulong __n;
  byte *pbVar9;
  string ss;
  vector<char,_std::allocator<char>_> _buff;
  TextureEntry local_c8;
  long *local_78;
  list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
  *local_70;
  char *local_68;
  ulong local_60;
  char local_58 [16];
  vector<char,_std::allocator<char>_> local_48;
  long *plVar6;
  
  paVar1 = &local_c8.
            super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .first.field_2;
  local_c8.
  super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .first._M_dataplus._M_p = (pointer)paVar1;
  local_70 = &fill->textures;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"rt","");
  iVar5 = (*io->_vptr_IOSystem[4])
                    (io,(pFile->_M_dataplus)._M_p,
                     local_c8.
                     super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .first._M_dataplus._M_p);
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.
         super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .first._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.
                    super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .first._M_dataplus._M_p);
  }
  if (plVar6 != (long *)0x0) {
    local_78 = plVar6;
    this = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                   "Loading Quake3 skin file ",pFile);
    Logger::info(this,local_c8.
                      super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.
           super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8.
                      super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .first._M_dataplus._M_p);
    }
    lVar7 = (**(code **)(*plVar6 + 0x30))(plVar6);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_48,lVar7 + 1,(allocator_type *)&local_c8);
    pbVar9 = (byte *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    (**(code **)(*plVar6 + 0x10))
              (plVar6,local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,lVar7,1);
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar7] = 0;
    for (pbVar8 = (byte *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        pbVar8 != (byte *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      if (*pbVar8 == 0x2c) {
        *pbVar8 = 0x20;
      }
    }
    bVar3 = *pbVar9;
    while (bVar3 != 0) {
      while( true ) {
        local_68 = local_58;
        if ((0x20 < (ulong)*pbVar9) || ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0)) break;
        pbVar9 = pbVar9 + 1;
      }
      while ((pbVar8 = pbVar9, (ulong)*pbVar9 < 0x21 &&
             ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0))) {
        pbVar9 = pbVar9 + 1;
      }
      while ((0x20 < (ulong)*pbVar8 || ((0x100003601U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))) {
        pbVar8 = pbVar8 + 1;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pbVar9,pbVar8);
      __n = local_60;
      if (3 < local_60) {
        __n = 4;
      }
      iVar5 = strncmp(local_68,"tag_",__n);
      pbVar9 = pbVar8;
      if (iVar5 != 0) {
        local_c8.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first.field_2._8_8_ = 0;
        local_c8.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second.field_2._8_8_ = 0;
        local_c8.resolved = false;
        local_c8._65_7_ = 0;
        local_c8.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first._M_string_length = 0;
        local_c8.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first.field_2._M_allocated_capacity = 0;
        paVar2 = &local_c8.
                  super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .second.field_2;
        local_c8.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second._M_string_length = 0;
        local_c8.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second.field_2._M_allocated_capacity = 0;
        local_c8.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first._M_dataplus._M_p = (pointer)paVar1;
        local_c8.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::
        list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
        ::_M_insert<Assimp::Q3Shader::SkinData::TextureEntry>(local_70,(iterator)local_70,&local_c8)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.
               super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .second._M_dataplus._M_p != paVar2) {
          operator_delete(local_c8.
                          super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.
               super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .first._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8.
                          super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .first._M_dataplus._M_p);
        }
        p_Var4 = (((_List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                    *)&(local_70->
                       super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                       )._M_impl)->_M_impl)._M_node.super__List_node_base._M_prev;
        std::__cxx11::string::_M_assign((string *)(p_Var4 + 1));
        while ((pbVar9 = pbVar8, (ulong)*pbVar8 < 0x21 &&
               ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
          pbVar8 = pbVar8 + 1;
        }
        while ((0x20 < (ulong)*pbVar9 || ((0x100003601U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0))) {
          pbVar9 = pbVar9 + 1;
        }
        local_c8.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pbVar8,pbVar9);
        std::__cxx11::string::operator=((string *)(p_Var4 + 3),(string *)&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.
               super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .first._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8.
                          super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .first._M_dataplus._M_p);
        }
      }
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      bVar3 = *pbVar9;
    }
    plVar6 = local_78;
    if ((byte *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      plVar6 = local_78;
    }
  }
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))(plVar6);
  }
  return plVar6 != (long *)0x0;
}

Assistant:

bool Q3Shader::LoadSkin(SkinData& fill, const std::string& pFile,IOSystem* io)
{
    std::unique_ptr<IOStream> file( io->Open( pFile, "rt"));
    if (!file.get())
        return false; // if we can't access the file, don't worry and return

    ASSIMP_LOG_INFO("Loading Quake3 skin file " + pFile);

    // read file in memory
    const size_t s = file->FileSize();
    std::vector<char> _buff(s+1);const char* buff = &_buff[0];
    file->Read(&_buff[0],s,1);
    _buff[s] = 0;

    // remove commas
    std::replace(_buff.begin(),_buff.end(),',',' ');

    // read token by token and fill output table
    for (;*buff;) {
        SkipSpacesAndLineEnd(&buff);

        // get first identifier
        std::string ss = GetNextToken(buff);

        // ignore tokens starting with tag_
        if (!::strncmp(&ss[0],"tag_",std::min((size_t)4, ss.length())))
            continue;

        fill.textures.push_back(SkinData::TextureEntry());
        SkinData::TextureEntry &entry = fill.textures.back();

        entry.first  = ss;
        entry.second = GetNextToken(buff);
    }
    return true;
}